

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O0

double __thiscall
spdlog::sinks::stdout_sink_base<spdlog::details::console_nullmutex>::log
          (stdout_sink_base<spdlog::details::console_nullmutex> *this,double __x)

{
  pointer pfVar1;
  char *__ptr;
  size_t __n;
  undefined8 in_RSI;
  double extraout_XMM0_Qa;
  memory_buf_t formatted;
  lock_guard<spdlog::details::null_mutex> lock;
  allocator<char> *in_stack_fffffffffffffe88;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  allocator<char> local_139;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_138;
  undefined8 local_10;
  stdout_sink_base<spdlog::details::console_nullmutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  std::lock_guard<spdlog::details::null_mutex>::lock_guard
            ((lock_guard<spdlog::details::null_mutex> *)in_stack_fffffffffffffe90,
             (mutex_type *)in_stack_fffffffffffffe88);
  std::allocator<char>::allocator();
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(&local_139);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x28751d);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,&local_138);
  this_00 = &local_138;
  __ptr = ::fmt::v8::detail::buffer<char>::data(&this_00->super_buffer<char>);
  __n = ::fmt::v8::detail::buffer<char>::size(&this_00->super_buffer<char>);
  fwrite(__ptr,1,__n,(FILE *)this->file_);
  fflush((FILE *)this->file_);
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  std::lock_guard<spdlog::details::null_mutex>::~lock_guard
            ((lock_guard<spdlog::details::null_mutex> *)0x28759a);
  return extraout_XMM0_Qa;
}

Assistant:

SPDLOG_INLINE void stdout_sink_base<ConsoleMutex>::log(const details::log_msg &msg)
{
#ifdef _WIN32
    if (handle_ == INVALID_HANDLE_VALUE)
    {
        return;
    }
    std::lock_guard<mutex_t> lock(mutex_);
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    ::fflush(file_); // flush in case there is something in this file_ already
    auto size = static_cast<DWORD>(formatted.size());
    DWORD bytes_written = 0;
    bool ok = ::WriteFile(handle_, formatted.data(), size, &bytes_written, nullptr) != 0;
    if (!ok)
    {
        throw_spdlog_ex("stdout_sink_base: WriteFile() failed. GetLastError(): " + std::to_string(::GetLastError()));
    }
#else
    std::lock_guard<mutex_t> lock(mutex_);
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    ::fwrite(formatted.data(), sizeof(char), formatted.size(), file_);
    ::fflush(file_); // flush every line to terminal
#endif // WIN32
}